

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureDivision.hpp
# Opt level: O2

bool __thiscall njoy::ENDFtk::StructureDivision::isSendPermissive(StructureDivision *this)

{
  bool bVar1;
  int iVar2;
  
  if (isSendPermissive()::empty == '\0') {
    iVar2 = __cxa_guard_acquire(&isSendPermissive()::empty);
    if (iVar2 != 0) {
      isSendPermissive::empty.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
      _M_head_impl = 0.0;
      isSendPermissive::empty.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
      isSendPermissive::empty.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
      super__Head_base<3UL,_long,_false>._M_head_impl = 0;
      isSendPermissive::empty.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl
           = 0;
      isSendPermissive::empty.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
      super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
      super__Tuple_impl<4UL,_long,_long> = (_Tuple_impl<4UL,_long,_long>)ZEXT816(0);
      __cxa_guard_release(&isSendPermissive()::empty);
    }
  }
  bVar1 = record::
          Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
          ::equality<6>(&this->base,&isSendPermissive::empty);
  return bVar1 && (this->tail).fields._M_elems[2] == 0;
}

Assistant:

bool isSendPermissive() const {

      const static Base empty(0.0, 0.0, 0, 0, 0, 0);
      return ( this->base == empty ) and ( this->tail.section() == 0 );
    }